

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

t_int * times_perform(t_int *w)

{
  int local_2c;
  float *pfStack_28;
  int n;
  t_sample *out;
  t_sample *in2;
  t_sample *in1;
  t_int *w_local;
  
  local_2c = (int)w[4];
  pfStack_28 = (float *)w[3];
  out = (t_sample *)w[2];
  in2 = (t_sample *)w[1];
  while (local_2c != 0) {
    *pfStack_28 = *in2 * *out;
    local_2c = local_2c + -1;
    pfStack_28 = pfStack_28 + 1;
    out = out + 1;
    in2 = in2 + 1;
  }
  return w + 5;
}

Assistant:

t_int *times_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--) *out++ = *in1++ * *in2++;
    return (w+5);
}